

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::EnsureMemoryBarrier
          (GLContextState *this,MEMORY_BARRIER RequiredBarriers,AsyncWritableResource *pRes)

{
  MEMORY_BARRIER MVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  GLenum err;
  MEMORY_BARRIER ResourcePendingBarriers;
  AsyncWritableResource *pRes_local;
  GLContextState *pGStack_10;
  MEMORY_BARRIER RequiredBarriers_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = 0;
  pRes_local._4_4_ = RequiredBarriers;
  pGStack_10 = this;
  if (pRes != (AsyncWritableResource *)0x0) {
    msg.field_2._12_4_ = AsyncWritableResource::GetPendingMemoryBarriers(pRes);
    operator&=((MEMORY_BARRIER *)((long)&pRes_local + 4),msg.field_2._12_4_);
  }
  MVar1 = this->m_PendingMemoryBarriers;
  operator&=((MEMORY_BARRIER *)((long)&pRes_local + 4),MVar1);
  if (pRes_local._4_4_ != MEMORY_BARRIER_NONE) {
    (*__glewMemoryBarrier)(pRes_local._4_4_);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"EnsureMemoryBarrier",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1c2,(char (*) [25])"glMemoryBarrier() failed",(char (*) [17])"\nGL Error Code: "
                 ,(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_48,(char (*) [6])0x4585f6);
      Message = (Char *)std::__cxx11::string::c_str();
      MVar1 = 0x461a1c;
      DebugAssertionFailed
                (Message,"EnsureMemoryBarrier",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1c2);
      std::__cxx11::string::~string((string *)local_48);
    }
    MVar1 = operator~((Diligent *)(ulong)pRes_local._4_4_,MVar1);
    operator&=(&this->m_PendingMemoryBarriers,MVar1);
  }
  if (pRes != (AsyncWritableResource *)0x0) {
    MVar1 = Diligent::operator&(this->m_PendingMemoryBarriers,msg.field_2._12_4_);
    AsyncWritableResource::ResetPendingMemoryBarriers(pRes,MVar1);
  }
  return;
}

Assistant:

void GLContextState::EnsureMemoryBarrier(MEMORY_BARRIER RequiredBarriers, AsyncWritableResource* pRes /* = nullptr */)
{
#if GL_ARB_shader_image_load_store
    // Every resource tracks its own pending memory barriers.
    // Device context also tracks which barriers have not been executed
    // When a resource with pending memory barrier flag is bound to the context,
    // the context checks if the same flag is set in its own pending barriers.
    // Thus a memory barrier is only executed if some resource required that barrier
    // and it has not been executed yet. This is almost optimal strategy, but slightly
    // imperfect as the following scenario shows:

    // Draw 1: Barriers_A |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 2: Barriers_B |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 3: Bind B, execute BARRIER: Barriers_B = 0, Barrier_Ctx = 0 (Barriers_A == BARRIER_FLAG)
    // Draw 4: Barriers_B |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 5: Bind A, execute BARRIER, Barriers_A = 0, Barrier_Ctx = 0 (Barriers_B == BARRIER_FLAG)

    // In the last draw call, barrier for resource A has already been executed when resource B was
    // bound to the pipeline. Since Resource A has not been bound since then, its flag has not been
    // cleared.
    // This situation does not seem to be a problem though since a barrier cannot be executed
    // twice in any situation

    MEMORY_BARRIER ResourcePendingBarriers = MEMORY_BARRIER_NONE;
    if (pRes)
    {
        // If resource is specified, only set up memory barriers
        // that are required by the resource
        ResourcePendingBarriers = pRes->GetPendingMemoryBarriers();
        RequiredBarriers &= ResourcePendingBarriers;
    }

    // Leave only pending barriers
    RequiredBarriers &= m_PendingMemoryBarriers;
    if (RequiredBarriers)
    {
        glMemoryBarrier(RequiredBarriers);
        DEV_CHECK_GL_ERROR("glMemoryBarrier() failed");
        m_PendingMemoryBarriers &= ~RequiredBarriers;
    }

    // Leave only these barriers that are still pending
    if (pRes)
        pRes->ResetPendingMemoryBarriers(m_PendingMemoryBarriers & ResourcePendingBarriers);
#else
    UNSUPPORTED("GL_ARB_shader_image_load_store is not supported");
#endif
}